

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O1

void TestConstExpr::ComparisonTestTU<unsigned_long_long,short>(void)

{
  if (ComparisonTestTU<unsigned_long_long,short>()::b1 == '\0') {
    ComparisonTestTU<unsigned_long_long,short>();
  }
  if (ComparisonTestTU<unsigned_long_long,short>()::b2 == '\0') {
    ComparisonTestTU<unsigned_long_long,short>();
  }
  if (ComparisonTestTU<unsigned_long_long,short>()::b3 == '\0') {
    ComparisonTestTU<unsigned_long_long,short>();
  }
  if (ComparisonTestTU<unsigned_long_long,short>()::b4 == '\0') {
    ComparisonTestTU<unsigned_long_long,short>();
  }
  if (ComparisonTestTU<unsigned_long_long,short>()::b5 == '\0') {
    ComparisonTestTU<unsigned_long_long,short>();
  }
  if (ComparisonTestTU<unsigned_long_long,short>()::b6 == '\0') {
    ComparisonTestTU<unsigned_long_long,short>();
  }
  return;
}

Assistant:

void ComparisonTestTU()
	{
		static bool b1 = LessThanTest<T, U>();
		static bool b2 = LessThanEqualTest<T, U>();
		static bool b3 = GreaterThanTest<T, U>();
		static bool b4 = GreaterThanEqualTest<T, U>();
		static bool b5 = EqualTest<T, U>();
		static bool b6 = NotEqualTest<T, U>();
	}